

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       list_caster<std::vector<Eigen::Matrix<double,1,5,1,1,5>,std::allocator<Eigen::Matrix<double,1,5,1,1,5>>>,Eigen::Matrix<double,1,5,1,1,5>>
       ::
       cast<std::vector<Eigen::Matrix<double,1,5,1,1,5>,std::allocator<Eigen::Matrix<double,1,5,1,1,5>>>const&>
                 (vector<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_std::allocator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
                  *src,return_value_policy policy,handle parent)

{
  pointer pMVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  pointer src_00;
  list l;
  object value_;
  
  list::list(&l,((long)(src->
                       super__Vector_base<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_std::allocator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(src->
                      super__Vector_base<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_std::allocator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x28);
  src_00 = (src->
           super__Vector_base<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_std::allocator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (src->
           super__Vector_base<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_std::allocator<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  do {
    hVar2.m_ptr = (PyObject *)l.super_object.super_handle.m_ptr;
    if (src_00 == pMVar1) {
      l.super_object.super_handle.m_ptr = (object)(handle)0x0;
      goto LAB_001fd764;
    }
    hVar2 = type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void>::cast(src_00,policy,parent);
    value_.super_handle = hVar2;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
      if ((*(byte *)(*(long *)((long)l.super_object.super_handle.m_ptr + 8) + 0xab) & 2) == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<Eigen::Matrix<double, 1, 5>>, Eigen::Matrix<double, 1, 5>>::cast(T &&, return_value_policy, handle) [Type = std::vector<Eigen::Matrix<double, 1, 5>>, Value = Eigen::Matrix<double, 1, 5>, T = const std::vector<Eigen::Matrix<double, 1, 5>> &]"
                     );
      }
      *(PyObject **)(*(long *)((long)l.super_object.super_handle.m_ptr + 0x18) + lVar3 * 8) =
           hVar2.m_ptr;
      lVar3 = lVar3 + 1;
    }
    pybind11::object::~object(&value_);
    src_00 = src_00 + 1;
  } while (hVar2.m_ptr != (PyObject *)0x0);
  hVar2.m_ptr = (PyObject *)0x0;
LAB_001fd764:
  pybind11::object::~object(&l.super_object);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }